

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O3

void __thiscall
embree::sse2::BVHNSubdivPatch1BuilderSAH<4>::build(BVHNSubdivPatch1BuilderSAH<4> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  BVHN<4> *this_00;
  Geometry *pGVar3;
  PrimRef *pPVar4;
  MemoryMonitorInterface *pMVar5;
  Settings settings;
  char cVar6;
  int iVar7;
  long *plVar8;
  ulong uVar9;
  PrimRef *pPVar10;
  NodeRef root;
  runtime_error *prVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  ulong uVar14;
  unsigned_long uVar15;
  long lVar16;
  ulong *puVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar18;
  size_t sVar19;
  EVP_PKEY_CTX *ctx;
  ulong uVar20;
  BVH *this_01;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  size_t *psVar26;
  size_t sVar27;
  ulong uVar28;
  float fVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  size_t taskCount;
  Iterator<embree::SubdivMesh,_false> iter;
  string __str;
  ProgressMonitorClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_subdiv_cpp:92:25)>
  virtualprogress;
  PrimInfo pinfo;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  anon_class_1_0_00000001 local_2db2;
  auto_partitioner local_2db1;
  unsigned_long local_2db0;
  BVHNSubdivPatch1BuilderSAH<4> *local_2da8;
  Iterator<embree::GridMesh,_false> local_2da0;
  anon_class_8_1_4d25ca37_conflict local_2d90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2d88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2d78;
  ulong local_2d68;
  ulong uStack_2d60;
  ulong local_2d58;
  ulong uStack_2d50;
  ulong local_2d48;
  ulong uStack_2d40;
  size_t *local_2d30;
  double local_2d28;
  anon_class_16_2_341d598e_conflict1 local_2d20;
  anon_class_8_1_898bcfc2_conflict7 local_2d10;
  BuildProgressMonitor local_2d08;
  BVHNSubdivPatch1BuilderSAH<4> *local_2d00;
  anon_class_48_6_afa08d2e_conflict1 local_2cf8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2cc8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2cb8;
  undefined1 local_2ca8 [16];
  undefined1 local_2c98 [16];
  long local_2c88;
  ulong local_2c80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2c48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c38 [31];
  ulong local_2a48 [64];
  ulong local_2848;
  ulong local_2840;
  ulong local_13f0 [632];
  
  sVar27 = (this->scene->world).numSubdivPatches;
  if (sVar27 == 0) {
    if ((this->prims).size_active != 0) {
      (this->prims).size_active = 0;
    }
    (this->prims).size_active = 0;
    this_01 = this->bvh;
    paVar18 = &local_2c48;
    goto LAB_00d764cc;
  }
  this_00 = this->bvh;
  local_2d88._0_8_ = &local_2d78;
  std::__cxx11::string::_M_construct((ulong)&local_2d88,'\x01');
  *(undefined1 *)local_2d88._0_8_ = 0x34;
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_2d88,0,(char *)0x0,0x1f8cf1e);
  paVar18 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)(plVar8 + 2);
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)*plVar8 == paVar18) {
    local_2cb8 = *paVar18;
    local_2cc8._0_8_ = &local_2cb8;
  }
  else {
    local_2cb8._0_8_ = *(long *)paVar18;
    local_2cc8._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)*plVar8;
  }
  local_2cc8._8_8_ = plVar8[1];
  *plVar8 = (long)paVar18;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2cc8);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar12) {
    local_2c38[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_2c38[0]._8_8_ = plVar8[3];
    local_2c48._0_8_ = local_2c38;
  }
  else {
    local_2c38[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_2c48._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar8;
  }
  local_2c48._8_8_ = plVar8[1];
  *plVar8 = (long)paVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_2d28 = BVHN<4>::preBuild(this_00,(string *)&local_2c48.field_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c48._0_8_ != local_2c38) {
    operator_delete((void *)local_2c48._0_8_);
  }
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_2cc8._0_8_ != &local_2cb8) {
    operator_delete((void *)local_2cc8._0_8_);
  }
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_2d88._0_8_ != &local_2d78) {
    operator_delete((void *)local_2d88._0_8_);
  }
  FastAllocator::init_estimate(&this->bvh->alloc,sVar27 << 5);
  local_2d08._vptr_BuildProgressMonitor = (_func_int **)&PTR_operator___02191dc0;
  local_2848 = 0;
  local_2da0.scene = this->scene;
  local_2da0.all = false;
  sVar27 = ((local_2da0.scene)->geometries).size_active;
  if (sVar27 == 0) {
    uVar24 = 0;
  }
  else {
    uVar24 = 0;
    sVar19 = 0;
    do {
      pGVar3 = ((local_2da0.scene)->geometries).items[sVar19].ptr;
      if (((pGVar3 == (Geometry *)0x0) || (((uint)pGVar3->field_8 & 0x2000ff) != 0x200017)) ||
         (pGVar3->numTimeSteps != 1)) {
        uVar13 = 0;
      }
      else {
        uVar13 = (ulong)pGVar3->numPrimitives;
      }
      uVar24 = uVar24 + uVar13;
      sVar19 = sVar19 + 1;
    } while (sVar27 != sVar19);
  }
  local_2d00 = this;
  local_2840 = uVar24;
  iVar7 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar13 = uVar24 + 0x3ff >> 10;
  if ((ulong)(long)iVar7 < uVar13) {
    uVar13 = (long)iVar7;
  }
  uVar25 = 0x40;
  if (uVar13 < 0x40) {
    uVar25 = uVar13;
  }
  uVar25 = uVar25 + (uVar25 == 0);
  local_2c48._0_8_ = 0;
  local_2a48[0] = 0;
  local_2848 = uVar25;
  if (1 < uVar13) {
    uVar23 = 0;
    uVar13 = uVar24 / uVar25;
    uVar20 = 1;
    lVar21 = 0;
    do {
      pGVar3 = ((local_2da0.scene)->geometries).items[lVar21].ptr;
      if (((pGVar3 == (Geometry *)0x0) ||
          ((SUB41(pGVar3->field_8,0) == '\x17' &
           ((byte)((uint)pGVar3->field_8 >> 0x15) | local_2da0.all)) != 1)) ||
         ((pGVar3->numTimeSteps != 1 || (uVar22 = (ulong)pGVar3->numPrimitives, uVar22 == 0)))) {
        uVar22 = 0;
        lVar16 = 0;
      }
      else {
        uVar14 = (uVar20 + 1) * uVar24;
        lVar16 = 0;
        uVar28 = 0;
        do {
          uVar9 = uVar13;
          uVar13 = uVar9;
          if ((uVar23 + uVar22 + lVar16 < uVar9) || (uVar25 <= uVar20)) break;
          *(long *)((long)&local_2c48 + uVar20 * 8) = lVar21;
          uVar28 = uVar28 + (uVar9 - uVar23);
          local_2a48[uVar20] = uVar28;
          uVar20 = uVar20 + 1;
          uVar13 = uVar14 / local_2848;
          lVar16 = -uVar28;
          uVar14 = uVar14 + uVar24;
          uVar23 = uVar9;
          uVar25 = local_2848;
        } while (uVar28 < uVar22);
      }
      uVar23 = uVar22 + uVar23 + lVar16;
      lVar21 = lVar21 + 1;
    } while (uVar20 < uVar25);
  }
  local_2d88._0_8_ = 0x7f8000007f800000;
  local_2d88._8_8_ = 0x7f8000007f800000;
  local_2d78._0_8_ = 0xff800000ff800000;
  local_2d78._8_8_ = 0xff800000ff800000;
  local_2d68 = 0x7f8000007f800000;
  uStack_2d60 = 0x7f8000007f800000;
  local_2d58 = 0xff800000ff800000;
  uStack_2d50 = 0xff800000ff800000;
  local_2d48 = 0;
  uStack_2d40 = 0;
  local_2d90.array2 = &local_2da0;
  local_2cf8.getSize = &local_2d90;
  local_2d20.func = (anon_class_1_0_00000001 *)&local_2db1;
  local_2cf8.func = &local_2d20;
  local_2cf8.taskCount = &local_2db0;
  local_2cf8.state =
       (ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *)
       &local_2c48;
  local_2cf8.identity = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_2d88;
  local_2cf8.reduction = &local_2db2;
  local_2cc8._12_2_ = 0x401;
  local_2ca8 = ZEXT816(0);
  local_2c88 = 8;
  local_2db0 = uVar25;
  local_2d20.array2 = local_2d90.array2;
  tbb::detail::r1::initialize((task_group_context *)&local_2cc8.field_1);
  local_2d10.func = &local_2cf8;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,uVar25,1,&local_2d10,(auto_partitioner *)&local_2da8,
             (task_group_context *)&local_2cc8.field_1);
  cVar6 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&local_2cc8.field_1);
  if (cVar6 != '\0') {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"task cancelled");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy((task_group_context *)&local_2cc8.field_1);
  uVar24 = local_2d48;
  uVar13 = uStack_2d40;
  if (local_2db0 != 0) {
    puVar17 = local_13f0;
    uVar15 = local_2db0;
    uVar32 = local_2d88._0_8_;
    uVar33 = local_2d88._8_8_;
    uVar25 = local_2d68;
    uVar23 = uStack_2d60;
    uVar30 = local_2d78._0_8_;
    uVar31 = local_2d78._8_8_;
    uVar20 = local_2d58;
    uVar22 = uStack_2d50;
    do {
      puVar17[-9] = uVar32;
      puVar17[-8] = uVar33;
      puVar17[-7] = uVar30;
      puVar17[-6] = uVar31;
      puVar17[-5] = uVar25;
      puVar17[-4] = uVar23;
      puVar17[-3] = uVar20;
      puVar17[-2] = uVar22;
      puVar17[-1] = uVar24;
      *puVar17 = uVar13;
      uVar24 = uVar24 + puVar17[-0x281];
      uVar13 = uVar13 + puVar17[-0x280];
      puVar17 = puVar17 + 10;
      uVar15 = uVar15 - 1;
      uVar32 = 0x7f8000007f800000;
      uVar33 = 0x7f8000007f800000;
      uVar25 = 0x7f8000007f800000;
      uVar23 = 0x7f8000007f800000;
      uVar30 = 0xff800000ff800000;
      uVar31 = 0xff800000ff800000;
      uVar20 = 0xff800000ff800000;
      uVar22 = 0xff800000ff800000;
    } while (uVar15 != 0);
  }
  if (uVar24 != 0) {
    uVar24 = (this->prims).size_alloced;
    uVar25 = uVar24;
    if ((uVar24 < uVar13) && (uVar25 = uVar13, uVar23 = uVar24, uVar24 != 0)) {
      do {
        uVar25 = uVar23 * 2 + (ulong)(uVar23 * 2 == 0);
        uVar23 = uVar25;
      } while (uVar25 < uVar13);
    }
    psVar26 = &(this->prims).size_active;
    if (uVar13 < (this->prims).size_active) {
      *psVar26 = uVar13;
    }
    if (uVar24 == uVar25) {
      *psVar26 = uVar13;
    }
    else {
      pPVar4 = (this->prims).items;
      local_2d30 = psVar26;
      if (uVar25 == 0) {
        sVar27 = 0;
LAB_00d76149:
        pPVar10 = (PrimRef *)alignedMalloc(sVar27,0x20);
      }
      else {
        pMVar5 = (this->prims).alloc.device;
        sVar27 = uVar25 << 5;
        (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,sVar27,0);
        if (sVar27 < 0x1c00000) goto LAB_00d76149;
        pPVar10 = (PrimRef *)os_malloc(sVar27,&(this->prims).alloc.hugepages);
      }
      (this->prims).items = pPVar10;
      if ((this->prims).size_active == 0) {
        sVar27 = (this->prims).size_alloced;
        if (pPVar4 != (PrimRef *)0x0) goto LAB_00d7619d;
      }
      else {
        lVar21 = 0x10;
        uVar24 = 0;
        do {
          pPVar10 = (this->prims).items;
          puVar1 = (undefined8 *)((long)pPVar4 + lVar21 + -0x10);
          uVar32 = puVar1[1];
          puVar2 = (undefined8 *)((long)pPVar10 + lVar21 + -0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar32;
          puVar2 = (undefined8 *)((long)&(pPVar4->lower).field_0 + lVar21);
          uVar32 = puVar2[1];
          puVar1 = (undefined8 *)((long)&(pPVar10->lower).field_0 + lVar21);
          *puVar1 = *puVar2;
          puVar1[1] = uVar32;
          uVar24 = uVar24 + 1;
          lVar21 = lVar21 + 0x20;
        } while (uVar24 < (this->prims).size_active);
        sVar27 = (this->prims).size_alloced;
LAB_00d7619d:
        if (sVar27 << 5 < 0x1c00000) {
          alignedFree(pPVar4);
        }
        else {
          os_free(pPVar4,sVar27 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar27 != 0) {
        pMVar5 = (this->prims).alloc.device;
        (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,sVar27 * -0x20,1);
      }
      (this->prims).size_active = uVar13;
      (this->prims).size_alloced = uVar25;
      psVar26 = local_2d30;
    }
    uVar24 = local_2848;
    if (uVar13 != 0) {
      local_2d88._0_8_ = 0x7f8000007f800000;
      local_2d88._8_8_ = 0x7f8000007f800000;
      local_2d78._0_8_ = 0xff800000ff800000;
      local_2d78._8_8_ = 0xff800000ff800000;
      local_2d68 = 0x7f8000007f800000;
      uStack_2d60 = 0x7f8000007f800000;
      local_2d58 = 0xff800000ff800000;
      uStack_2d50 = 0xff800000ff800000;
      local_2d48 = 0;
      uStack_2d40 = 0;
      local_2d90.array2 = &local_2da0;
      local_2d20.func = (anon_class_1_0_00000001 *)&local_2da8;
      local_2db0 = local_2848;
      local_2cf8.state =
           (ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *)
           &local_2c48;
      local_2cf8.taskCount = &local_2db0;
      local_2cf8.identity = (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_2d88;
      local_2cf8.reduction = &local_2db2;
      local_2cf8.func = &local_2d20;
      local_2cc8._12_2_ = 0x401;
      local_2ca8 = ZEXT816(0);
      local_2c88 = 8;
      local_2da8 = this;
      local_2d20.array2 = local_2d90.array2;
      local_2cf8.getSize = &local_2d90;
      tbb::detail::r1::initialize((task_group_context *)&local_2cc8.field_1);
      local_2d10.func = &local_2cf8;
      tbb::detail::d1::
      parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
                (0,uVar24,1,&local_2d10,&local_2db1,(task_group_context *)&local_2cc8.field_1);
      cVar6 = tbb::detail::r1::is_group_execution_cancelled
                        ((task_group_context *)&local_2cc8.field_1);
      if (cVar6 == '\0') {
        tbb::detail::r1::destroy((task_group_context *)&local_2cc8.field_1);
        local_2cc8._8_8_ = local_2d88._8_8_;
        local_2cc8._0_8_ = local_2d88._0_8_;
        local_2cb8._8_8_ = local_2d78._8_8_;
        local_2cb8._0_8_ = local_2d78._0_8_;
        local_2ca8._8_8_ = uStack_2d60;
        local_2ca8._0_8_ = local_2d68;
        local_2c98._8_8_ = uStack_2d50;
        local_2c98._0_8_ = local_2d58;
        local_2c80 = uStack_2d40;
        if (local_2db0 != 0) {
          puVar17 = local_13f0;
          uVar15 = local_2db0;
          uVar24 = local_2d48;
          do {
            *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
             ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar17 + -9))->m128 = local_2cc8;
            *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
             ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar17 + -7))->m128 = local_2cb8;
            *(undefined1 (*) [16])(puVar17 + -5) = local_2ca8;
            *(undefined1 (*) [16])(puVar17 + -3) = local_2c98;
            puVar17[-1] = uVar24;
            *puVar17 = local_2c80;
            local_2cc8.m128 =
                 (__m128)minps(local_2cc8.m128,*(undefined1 (*) [16])(puVar17 + -0x289));
            local_2cb8.m128 =
                 (__m128)maxps(local_2cb8.m128,*(undefined1 (*) [16])(puVar17 + -0x287));
            local_2ca8 = minps(local_2ca8,*(undefined1 (*) [16])(puVar17 + -0x285));
            local_2c98 = maxps(local_2c98,*(undefined1 (*) [16])(puVar17 + -0x283));
            uVar24 = uVar24 + puVar17[-0x281];
            local_2c80 = local_2c80 + puVar17[-0x280];
            puVar17 = puVar17 + 10;
            uVar15 = uVar15 - 1;
          } while (uVar15 != 0);
        }
        local_2c88 = 0;
        for (iVar7 = 0x1f; 4U >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
        local_2d78._0_8_ = SEXT48(iVar7);
        local_2d88._0_8_ = 2;
        local_2d88._8_8_ = 0x20;
        local_2d78._8_8_ = 1;
        local_2d68 = 1;
        uStack_2d60 = 0x3f8000003f800000;
        local_2d58 = 0x400;
        uStack_2d50 = 0xffffffffffffffff;
        local_2cf8.state =
             (ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *)
             &PTR_createLeaf_02191e80;
        settings.maxDepth = 0x20;
        settings.branchingFactor = 2;
        settings.logBlockSize = local_2d78._0_8_;
        settings.minLeafSize = 1;
        settings.maxLeafSize = 1;
        settings.travCost = 1.0;
        settings.intCost = 1.0;
        settings.singleThreadThreshold = 0x400;
        settings.primrefarrayalloc = 0xffffffffffffffff;
        root = BVHNBuilderVirtual<4>::BVHNBuilderV::build
                         ((BVHNBuilderV *)&local_2cf8,&this->bvh->alloc,&local_2d08,
                          (this->prims).items,(PrimInfo *)&local_2cc8.field_1,settings);
        local_2d88._0_8_ = local_2cc8._0_8_;
        local_2d88._8_8_ = local_2cc8._8_8_;
        local_2d78._0_8_ = local_2cb8._0_8_;
        local_2d78._8_8_ = local_2cb8._8_8_;
        local_2d68 = local_2cc8._0_8_;
        uStack_2d60 = local_2cc8._8_8_;
        local_2d58 = local_2cb8._0_8_;
        uStack_2d50 = local_2cb8._8_8_;
        BVHN<4>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_2d88.field_1,
                     local_2c80 - local_2c88);
        fVar29 = (float)(local_2c80 - local_2c88) * 0.005;
        uVar24 = (ulong)fVar29;
        ctx = (EVP_PKEY_CTX *)((long)(fVar29 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
        BVHN<4>::layoutLargeNodes(this->bvh,(size_t)ctx);
        if ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE) {
          sVar27 = (this->prims).size_alloced;
          pPVar4 = (this->prims).items;
          if (pPVar4 != (PrimRef *)0x0) {
            ctx = (EVP_PKEY_CTX *)(sVar27 << 5);
            if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
              alignedFree(pPVar4);
            }
            else {
              os_free(pPVar4,(size_t)ctx,(this->prims).alloc.hugepages);
            }
          }
          if (sVar27 != 0) {
            pMVar5 = (this->prims).alloc.device;
            ctx = (EVP_PKEY_CTX *)(sVar27 * -0x20);
            (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,ctx,1);
          }
          *psVar26 = 0;
          psVar26[1] = 0;
          psVar26[2] = 0;
        }
        BVHN<4>::cleanup(this->bvh,ctx);
        BVHN<4>::postBuild(this->bvh,local_2d28);
        return;
      }
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"task cancelled");
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  this_01 = this->bvh;
  paVar18 = &local_2cc8;
LAB_00d764cc:
  *(undefined8 *)&(((BBox<embree::Vec3fa> *)&(paVar18->field_1).x)->lower).field_0 =
       0x7f8000007f800000;
  *(undefined8 *)&(paVar18->field_1).z = 0x7f8000007f800000;
  ((anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 *)((long)paVar18 + 0xc))->
  y = -INFINITY;
  ((anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 *)((long)paVar18 + 0xc))->
  z = -INFINITY;
  ((anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 *)((long)paVar18 + 0x18))
  ->x = -INFINITY;
  ((anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 *)((long)paVar18 + 0x18))
  ->y = -INFINITY;
  *(undefined8 *)&(((BBox<embree::Vec3fa> *)(paVar18->m128 + 8))->lower).field_0 =
       0x7f8000007f800000;
  *(float *)((long)paVar18 + 0x28) = INFINITY;
  *(float *)((long)paVar18 + 0x2c) = INFINITY;
  *(undefined8 *)&((Vec3fa *)(paVar18->m128 + 0xc))->field_0 = 0xff800000ff800000;
  *(float *)((long)paVar18 + 0x38) = -INFINITY;
  *(float *)((long)paVar18 + 0x3c) = -INFINITY;
  BVHN<4>::set(this_01,(NodeRef)0x8,(LBBox3fa *)&paVar18->field_1,0);
  return;
}

Assistant:

void build() 
      {
        /* skip build for empty scene */
        const size_t numPrimitives = scene->getNumPrimitives(SubdivMesh::geom_type,false);
        if (numPrimitives == 0) {
          prims.resize(numPrimitives);
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }
 
        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "SubdivPatch1BuilderSAH");

        //bvh->alloc.reset();
        bvh->alloc.init_estimate(numPrimitives*sizeof(PrimRef));

        auto progress = [&] (size_t dn) { bvh->scene->progressMonitor(double(dn)); };
        auto virtualprogress = BuildProgressMonitorFromClosure(progress);

        ParallelForForPrefixSumState<PrimInfo> pstate;
        
        /* initialize allocator and parallel_for_for_prefix_sum */
        Scene::Iterator<SubdivMesh> iter(scene);
        pstate.init(iter,size_t(1024));

        PrimInfo pinfo1 = parallel_for_for_prefix_sum0( pstate, iter, PrimInfo(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t /*geomID*/) -> PrimInfo
        { 
          size_t p = 0;
          size_t g = 0;
          for (size_t f=r.begin(); f!=r.end(); ++f) {          
            if (!mesh->valid(f)) continue;
            patch_eval_subdivision(mesh->getHalfEdge(0,f),[&](const Vec2f uv[4], const int subdiv[4], const float edge_level[4], int subPatch)
            {
              float level[4]; SubdivPatch1Base::computeEdgeLevels(edge_level,subdiv,level);
              Vec2i grid = SubdivPatch1Base::computeGridSize(level);
              size_t num = getNumEagerLeaves(grid.x,grid.y);
              g+=num;
              p++;
            });
          }
          return PrimInfo(p,g,empty);
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo(a.begin+b.begin,a.end+b.end,empty); });
        size_t numSubPatches = pinfo1.begin;
        if (numSubPatches == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }

        prims.resize(pinfo1.end);
        if (pinfo1.end == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }

        PrimInfo pinfo3 = parallel_for_for_prefix_sum1( pstate, iter, PrimInfo(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfo& base) -> PrimInfo
        {
          Allocator alloc = bvh->alloc.getCachedAllocator();
          
          PrimInfo s(empty);
          for (size_t f=r.begin(); f!=r.end(); ++f) {
            if (!mesh->valid(f)) continue;
            
            patch_eval_subdivision(mesh->getHalfEdge(0,f),[&](const Vec2f uv[4], const int subdiv[4], const float edge_level[4], int subPatch)
            {
              SubdivPatch1Base patch(unsigned(geomID),unsigned(f),subPatch,mesh,0,uv,edge_level,subdiv,VSIZEX);
              size_t num = createEager(patch,scene,mesh,unsigned(f),alloc,&prims[base.end+s.end]);
              assert(num == getNumEagerLeaves(patch.grid_u_res,patch.grid_v_res));
              for (size_t i=0; i<num; i++)
                s.add_center2(prims[base.end+s.end]);
              s.begin++;
            });
          }
          return s;
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a, b); });

        PrimInfo pinfo(0,pinfo3.end,pinfo3);
        
        auto createLeaf = [&] (const PrimRef* prims, const range<size_t>& range, Allocator alloc) -> NodeRef {
          assert(range.size() == 1);
          size_t leaf = (size_t) prims[range.begin()].ID();
          return NodeRef(leaf);
        };

        /* settings for BVH build */
        GeneralBVHBuilder::Settings settings;
        settings.logBlockSize = bsr(N);
        settings.minLeafSize = 1;
        settings.maxLeafSize = 1;
        settings.travCost = 1.0f;
        settings.intCost = 1.0f;
        settings.singleThreadThreshold = DEFAULT_SINGLE_THREAD_THRESHOLD;

        NodeRef root = BVHNBuilderVirtual<N>::build(&bvh->alloc,createLeaf,virtualprogress,prims.data(),pinfo,settings);
        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));
        
	/* clear temporary data for static geometry */
	if (scene->isStaticAccel()) {
          prims.clear();
        }
        bvh->cleanup();
        bvh->postBuild(t0);
      }